

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_426d84::FunctionEncoding::printRight(FunctionEncoding *this,OutputStream *S)

{
  StringView local_88;
  StringView local_78;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  FunctionEncoding *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"(");
  OutputStream::operator+=(local_18,local_28);
  NodeArray::printWithComma(&this->Params,local_18);
  StringView::StringView(&local_38,")");
  OutputStream::operator+=(local_18,local_38);
  if (this->Ret != (Node *)0x0) {
    (*this->Ret->_vptr_Node[5])(this->Ret,local_18);
  }
  if ((this->CVQuals & QualConst) != QualNone) {
    StringView::StringView(&local_48," const");
    OutputStream::operator+=(local_18,local_48);
  }
  if ((this->CVQuals & QualVolatile) != QualNone) {
    StringView::StringView(&local_58," volatile");
    OutputStream::operator+=(local_18,local_58);
  }
  if ((this->CVQuals & QualRestrict) != QualNone) {
    StringView::StringView(&local_68," restrict");
    OutputStream::operator+=(local_18,local_68);
  }
  if (this->RefQual == FrefQualLValue) {
    StringView::StringView(&local_78," &");
    OutputStream::operator+=(local_18,local_78);
  }
  else if (this->RefQual == FrefQualRValue) {
    StringView::StringView(&local_88," &&");
    OutputStream::operator+=(local_18,local_88);
  }
  if (this->Attrs != (Node *)0x0) {
    Node::print(this->Attrs,local_18);
  }
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    S += "(";
    Params.printWithComma(S);
    S += ")";
    if (Ret)
      Ret->printRight(S);

    if (CVQuals & QualConst)
      S += " const";
    if (CVQuals & QualVolatile)
      S += " volatile";
    if (CVQuals & QualRestrict)
      S += " restrict";

    if (RefQual == FrefQualLValue)
      S += " &";
    else if (RefQual == FrefQualRValue)
      S += " &&";

    if (Attrs != nullptr)
      Attrs->print(S);
  }